

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Else(w3Interp *this)

{
  BlockEnd(this);
  (this->super_Wasm).instr =
       (this->frame->code->decoded_instructions).
       super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>._M_impl.
       super__Vector_impl_data._M_start +
       ((((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.field_8.if_end - 1)
  ;
  return;
}

Assistant:

INTERP (Else)
{
     __debugbreak ();

    // Else marks the end of If is like BlockEnd, but also
    // skips the Else block.
    //.
    // If we are actually running the else case,
    // the If will have branched past the else instruction.

    BlockEnd ();
    // Branch to one before target, because interpreter loop will increment.
    instr = &frame->code->decoded_instructions [instr->if_end] - 1;
}